

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall asl::Socket_::skip(Socket_ *this,int n)

{
  uint uVar1;
  uchar *puVar2;
  Array<unsigned_char> local_20;
  ByteArray a;
  int n_local;
  Socket_ *this_local;
  
  a._a._4_4_ = n;
  Array<unsigned_char>::Array(&local_20,n);
  puVar2 = Array<unsigned_char>::data(&local_20);
  uVar1 = Array<unsigned_char>::length(&local_20);
  (*(this->super_SmartObject_)._vptr_SmartObject_[0xd])(this,puVar2,(ulong)uVar1);
  Array<unsigned_char>::~Array(&local_20);
  return;
}

Assistant:

void Socket_::skip(int n)
{
	ByteArray a(n);
	read(a.data(), a.length());
}